

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# job_manager.cpp
# Opt level: O2

Error * __thiscall
ot::commissioner::JobManager::PrepareDtlsConfig
          (Error *__return_storage_ptr__,JobManager *this,uint64_t aNid,Config *aConfig)

{
  char cVar1;
  ErrorCode EVar2;
  Status SVar3;
  bool bVar4;
  bool bVar5;
  bool bVar6;
  BorderRouter *br;
  char *pcVar7;
  type atVar8 [2];
  pointer pBVar9;
  char *pcVar10;
  ushort uVar11;
  string *this_00;
  string *psVar12;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v10::basic_format_context<fmt::v10::appender,_char>_>_2
  in_R9;
  byte bVar13;
  undefined1 uVar14;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  string_view fmt_02;
  string_view fmt_03;
  string_view fmt_04;
  string_view fmt_05;
  string_view fmt_06;
  format_args args;
  format_args args_00;
  format_args args_01;
  format_args args_02;
  format_args args_03;
  format_args args_04;
  format_args args_05;
  format_args args_06;
  allocator local_299;
  uint64_t local_298;
  uint local_28c;
  undefined1 local_288 [8];
  _Alloc_hider _Stack_280;
  undefined1 local_278 [24];
  code *local_260;
  code *local_258;
  string local_250;
  int local_22c;
  JobManager *local_228;
  undefined1 local_220 [40];
  writer write;
  char *pcStack_1f0;
  string domainName;
  BRArray brs;
  SecurityMaterials dtlsConfig;
  string local_110;
  string local_f0;
  string local_d0;
  string local_b0;
  Network nwk;
  
  __return_storage_ptr__->mCode = kNone;
  (__return_storage_ptr__->mMessage)._M_dataplus._M_p =
       (pointer)&(__return_storage_ptr__->mMessage).field_2;
  (__return_storage_ptr__->mMessage)._M_string_length = 0;
  psVar12 = &__return_storage_ptr__->mMessage;
  (__return_storage_ptr__->mMessage).field_2._M_local_buf[0] = '\0';
  domainName._M_dataplus._M_p = (pointer)&domainName.field_2;
  domainName._M_string_length = 0;
  domainName.field_2._M_local_buf[0] = '\0';
  dtlsConfig.mCommissionerToken.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  dtlsConfig.mCommissionerToken.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  dtlsConfig.mTrustAnchor.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  dtlsConfig.mTrustAnchor.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dtlsConfig.mCertificate.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dtlsConfig.mTrustAnchor.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  dtlsConfig.mCertificate.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  dtlsConfig.mCertificate.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  dtlsConfig.mPrivateKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  dtlsConfig.mPrivateKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dtlsConfig.mPSKc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  dtlsConfig.mPrivateKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  dtlsConfig.mPSKc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  dtlsConfig.mPSKc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  dtlsConfig.mCommissionerToken.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
  _M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  persistent_storage::Network::Network(&nwk);
  brs.
  super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  brs.
  super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  brs.
  super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_298 = aNid;
  local_228 = this;
  atVar8[0]._0_1_ =
       persistent_storage::Registry::GetBorderRoutersInNetwork
                 ((this->mInterpreter->mRegistry).
                  super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                  ._M_ptr,aNid,&brs);
  if ((Status)atVar8[0] == kSuccess) {
    bVar6 = false;
    bVar13 = 0;
    for (pBVar9 = brs.
                  super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                  ._M_impl.super__Vector_impl_data._M_start;
        pBVar9 != brs.
                  super__Vector_base<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
                  ._M_impl.super__Vector_impl_data._M_finish; pBVar9 = pBVar9 + 1) {
      uVar11 = *(ushort *)&(pBVar9->mAgent).mState & 7;
      if ((ushort)(uVar11 - 3) < 2) {
        bVar6 = true;
      }
      if ((uVar11 | 2) == 3) {
        bVar13 = 1;
      }
    }
    SVar3 = persistent_storage::Registry::GetNetworkByXpan
                      ((local_228->mInterpreter->mRegistry).
                       super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                       ._M_ptr,local_298,&nwk);
    if (SVar3 == kSuccess) {
      local_22c = nwk.mCcm;
      uVar14 = 0 < nwk.mCcm;
      SVar3 = persistent_storage::Registry::GetDomainNameByXpan
                        ((local_228->mInterpreter->mRegistry).
                         super___shared_ptr<ot::commissioner::persistent_storage::Registry,_(__gnu_cxx::_Lock_policy)2>
                         ._M_ptr,local_298,&domainName);
      if (SVar3 != kSuccess) {
        local_28c = CONCAT31(local_28c._1_3_,uVar14);
        std::__cxx11::string::string((string *)local_220,"job-manager",&local_299);
        local_288._0_4_ = string_type;
        local_288._4_4_ = int_type;
        _Stack_280._M_p = "{}: domain resolution failed with status={}";
        local_278._0_8_ = 0x2b;
        local_278._8_8_ = 0x200000000;
        local_260 = ::fmt::v10::detail::
                    parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
        ;
        local_258 = ::fmt::v10::detail::
                    parse_format_specs<int,fmt::v10::detail::compile_parse_context<char>>;
        pcVar7 = "{}: domain resolution failed with status={}";
        local_278._16_8_ =
             (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_288;
        write.handler_ =
             (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
              *)local_288;
        while (pcVar7 != "") {
          cVar1 = *pcVar7;
          pcVar10 = pcVar7;
          while (cVar1 != '{') {
            pcVar10 = pcVar10 + 1;
            if (pcVar10 == "") {
              ::fmt::v10::detail::
              parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
              ::writer::operator()(&write,pcVar7,"");
              goto LAB_00142b29;
            }
            cVar1 = *pcVar10;
          }
          ::fmt::v10::detail::
          parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_int>_>
          ::writer::operator()(&write,pcVar7,pcVar10);
          pcVar7 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string,int>&>
                             (pcVar10,"",
                              (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                               *)local_288);
        }
LAB_00142b29:
        utils::Hex<unsigned_long>((string *)&write,local_298);
        local_278._0_8_ = ZEXT18(SVar3);
        local_288 = (undefined1  [8])write.handler_;
        _Stack_280._M_p = pcStack_1f0;
        fmt_01.size_ = 0x1d;
        fmt_01.data_ = (char *)0x2b;
        args_01.field_1.args_ = in_R9.args_;
        args_01.desc_ = (unsigned_long_long)local_288;
        ::fmt::v10::vformat_abi_cxx11_
                  (&local_250,(v10 *)"{}: domain resolution failed with status={}",fmt_01,args_01);
        uVar14 = (undefined1)local_28c;
        Log(kDebug,(string *)local_220,&local_250);
        std::__cxx11::string::~string((string *)&local_250);
        std::__cxx11::string::~string((string *)&write);
        std::__cxx11::string::~string((string *)local_220);
      }
      aConfig->mEnableCcm = (bool)uVar14;
      local_28c = (uint)bVar13;
      if ((domainName._M_string_length == 0) || (!bVar6)) {
LAB_00142e37:
        utils::Hex<unsigned_long>((string *)local_220,nwk.mXpan);
        bVar4 = (bool)((byte)local_28c & 1);
        security_material::GetNetworkSM
                  ((Error *)local_288,(string *)local_220,bVar6,bVar4,&dtlsConfig);
        Error::operator=(__return_storage_ptr__,(Error *)local_288);
        std::__cxx11::string::~string((string *)&_Stack_280);
        std::__cxx11::string::~string((string *)local_220);
        local_288 = (undefined1  [8])((ulong)local_288 & 0xffffffff00000000);
        _Stack_280._M_p = local_278 + 8;
        local_278._0_8_ = (pointer)0x0;
        local_278._8_8_ = local_278._8_8_ & 0xffffffffffffff00;
        EVar2 = __return_storage_ptr__->mCode;
        std::__cxx11::string::~string((string *)&_Stack_280);
        if (EVar2 != kNone) {
          std::__cxx11::string::string((string *)local_220,"job-manager",(allocator *)&write);
          local_288._0_4_ = string_type;
          _Stack_280._M_p = "{}";
          local_278._0_8_ = 2;
          local_278._8_8_ = 0x100000000;
          local_260 = ::fmt::v10::detail::
                      parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
          ;
          pcVar7 = "{}";
          local_278._16_8_ =
               (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_288;
          while (pcVar10 = pcVar7, pcVar10 != "") {
            pcVar7 = pcVar10 + 1;
            if (*pcVar10 == '}') {
              if ((pcVar7 == "") || (*pcVar7 != '}')) {
                ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
              }
              pcVar7 = pcVar10 + 2;
            }
            else if (*pcVar10 == '{') {
              pcVar7 = ::fmt::v10::detail::
                       parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                                 (pcVar10,"",(format_string_checker<char> *)local_288);
            }
          }
          local_288 = (undefined1  [8])(__return_storage_ptr__->mMessage)._M_dataplus._M_p;
          _Stack_280._M_p = (pointer)(__return_storage_ptr__->mMessage)._M_string_length;
          fmt_03.size_ = 0xd;
          fmt_03.data_ = (char *)0x2;
          args_03.field_1.args_ = in_R9.args_;
          args_03.desc_ = (unsigned_long_long)local_288;
          ::fmt::v10::vformat_abi_cxx11_(&local_250,(v10 *)0x1f0fe1,fmt_03,args_03);
          Log(kDebug,(string *)local_220,&local_250);
          std::__cxx11::string::~string((string *)&local_250);
          std::__cxx11::string::~string((string *)local_220);
          if (__return_storage_ptr__->mCode != kNotFound) {
            std::__cxx11::string::string((string *)&local_d0,(string *)psVar12);
            WarningMsg(local_228,local_298,&local_d0);
            std::__cxx11::string::~string((string *)&local_d0);
          }
          local_288 = (undefined1  [8])((ulong)local_288 & 0xffffffff00000000);
          _Stack_280._M_p = local_278 + 8;
          local_278._0_8_ = (pointer)0x0;
          local_278._8_8_ = local_278._8_8_ & 0xffffffffffffff00;
          Error::operator=(__return_storage_ptr__,(Error *)local_288);
          std::__cxx11::string::~string((string *)&_Stack_280);
        }
        bVar5 = security_material::SecurityMaterials::IsAnyFound(&dtlsConfig,bVar6,bVar4,false);
        if (!bVar5) {
          security_material::GetNetworkSM((Error *)local_288,&nwk.mName,bVar6,bVar4,&dtlsConfig);
          Error::operator=(__return_storage_ptr__,(Error *)local_288);
          std::__cxx11::string::~string((string *)&_Stack_280);
          local_288 = (undefined1  [8])((ulong)local_288 & 0xffffffff00000000);
          _Stack_280._M_p = local_278 + 8;
          local_278._0_8_ = (pointer)0x0;
          local_278._8_8_ = local_278._8_8_ & 0xffffffffffffff00;
          EVar2 = __return_storage_ptr__->mCode;
          std::__cxx11::string::~string((string *)&_Stack_280);
          if (EVar2 != kNone) {
            std::__cxx11::string::string((string *)local_220,"job-manager",(allocator *)&write);
            local_288._0_4_ = string_type;
            _Stack_280._M_p = "{}";
            local_278._0_8_ = 2;
            local_278._8_8_ = 0x100000000;
            local_260 = ::fmt::v10::detail::
                        parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
            ;
            pcVar7 = "{}";
            local_278._16_8_ =
                 (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                  *)local_288;
            while (pcVar10 = pcVar7, pcVar10 != "") {
              pcVar7 = pcVar10 + 1;
              if (*pcVar10 == '}') {
                if ((pcVar7 == "") || (*pcVar7 != '}')) {
                  ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
                }
                pcVar7 = pcVar10 + 2;
              }
              else if (*pcVar10 == '{') {
                pcVar7 = ::fmt::v10::detail::
                         parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                                   (pcVar10,"",(format_string_checker<char> *)local_288);
              }
            }
            local_288 = (undefined1  [8])(__return_storage_ptr__->mMessage)._M_dataplus._M_p;
            _Stack_280._M_p = (pointer)(__return_storage_ptr__->mMessage)._M_string_length;
            fmt_04.size_ = 0xd;
            fmt_04.data_ = (char *)0x2;
            args_04.field_1.args_ = in_R9.args_;
            args_04.desc_ = (unsigned_long_long)local_288;
            ::fmt::v10::vformat_abi_cxx11_(&local_250,(v10 *)0x1f0fe1,fmt_04,args_04);
            Log(kDebug,(string *)local_220,&local_250);
            std::__cxx11::string::~string((string *)&local_250);
            std::__cxx11::string::~string((string *)local_220);
            if (__return_storage_ptr__->mCode != kNotFound) {
              std::__cxx11::string::string((string *)&local_f0,(string *)psVar12);
              WarningMsg(local_228,local_298,&local_f0);
              std::__cxx11::string::~string((string *)&local_f0);
            }
            this_00 = (string *)&_Stack_280;
            local_288 = (undefined1  [8])((ulong)local_288 & 0xffffffff00000000);
            _Stack_280._M_p = local_278 + 8;
            local_278._0_8_ = (pointer)0x0;
            local_278._8_8_ = local_278._8_8_ & 0xffffffffffffff00;
            Error::operator=(__return_storage_ptr__,(Error *)local_288);
LAB_00143235:
            std::__cxx11::string::~string(this_00);
          }
        }
      }
      else {
        std::__cxx11::string::_M_assign((string *)&aConfig->mDomainName);
        bVar4 = std::operator!=(&domainName,"DefaultDomain");
        if (!bVar4) {
          local_288 = (undefined1  [8])((ulong)local_288 & 0xffffffff00000000);
          _Stack_280._M_p = local_278 + 8;
          local_278._0_8_ = (pointer)0x0;
          local_278._8_8_ = local_278._8_8_ & 0xffffffffffffff00;
          Error::operator=(__return_storage_ptr__,(Error *)local_288);
          std::__cxx11::string::~string((string *)&_Stack_280);
          goto LAB_00142e37;
        }
        security_material::GetDomainSM((Error *)local_288,&domainName,&dtlsConfig);
        Error::operator=(__return_storage_ptr__,(Error *)local_288);
        std::__cxx11::string::~string((string *)&_Stack_280);
        local_288 = (undefined1  [8])((ulong)local_288 & 0xffffffff00000000);
        local_278._0_8_ = (pointer)0x0;
        local_278._8_8_ = local_278._8_8_ & 0xffffffffffffff00;
        EVar2 = __return_storage_ptr__->mCode;
        _Stack_280._M_p = local_278 + 8;
        std::__cxx11::string::~string((string *)&_Stack_280);
        if (EVar2 != kNone) {
          std::__cxx11::string::string((string *)local_220,"job-manager",(allocator *)&write);
          local_288._0_4_ = string_type;
          _Stack_280._M_p = "{}";
          local_278._0_8_ = 2;
          local_278._8_8_ = 0x100000000;
          local_260 = ::fmt::v10::detail::
                      parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
          ;
          pcVar7 = "{}";
          local_278._16_8_ =
               (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_288;
          while (pcVar10 = pcVar7, pcVar10 != "") {
            pcVar7 = pcVar10 + 1;
            if (*pcVar10 == '}') {
              if ((pcVar7 == "") || (*pcVar7 != '}')) {
                ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
              }
              pcVar7 = pcVar10 + 2;
            }
            else if (*pcVar10 == '{') {
              pcVar7 = ::fmt::v10::detail::
                       parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                                 (pcVar10,"",(format_string_checker<char> *)local_288);
            }
          }
          local_288 = (undefined1  [8])(__return_storage_ptr__->mMessage)._M_dataplus._M_p;
          _Stack_280._M_p = (pointer)(__return_storage_ptr__->mMessage)._M_string_length;
          fmt_02.size_ = 0xd;
          fmt_02.data_ = (char *)0x2;
          args_02.field_1.args_ = in_R9.args_;
          args_02.desc_ = (unsigned_long_long)local_288;
          ::fmt::v10::vformat_abi_cxx11_(&local_250,(v10 *)0x1f0fe1,fmt_02,args_02);
          Log(kDebug,(string *)local_220,&local_250);
          std::__cxx11::string::~string((string *)&local_250);
          std::__cxx11::string::~string((string *)local_220);
          if (__return_storage_ptr__->mCode != kNotFound) {
            std::__cxx11::string::string((string *)&local_b0,(string *)psVar12);
            WarningMsg(local_228,local_298,&local_b0);
            std::__cxx11::string::~string((string *)&local_b0);
          }
          local_288 = (undefined1  [8])((ulong)local_288 & 0xffffffff00000000);
          local_278._0_8_ = (pointer)0x0;
          local_278._8_8_ = local_278._8_8_ & 0xffffffffffffff00;
          _Stack_280._M_p = local_278 + 8;
          Error::operator=(__return_storage_ptr__,(Error *)local_288);
          std::__cxx11::string::~string((string *)&_Stack_280);
        }
        bVar4 = security_material::SecurityMaterials::IsEmpty(&dtlsConfig,0 < local_22c);
        if (bVar4) goto LAB_00142e37;
        if (bVar13 != 0) {
          std::__cxx11::string::string((string *)local_220,"job-manager",&local_299);
          local_288._0_4_ = string_type;
          local_288._4_4_ = string_type;
          _Stack_280._M_p = "loading PSKc ignored for CCM network [{}:\'{}\']";
          local_278._0_8_ = 0x2e;
          local_278._8_8_ = 0x200000000;
          local_260 = ::fmt::v10::detail::
                      parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
          ;
          local_258 = ::fmt::v10::detail::
                      parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
          ;
          pcVar7 = "loading PSKc ignored for CCM network [{}:\'{}\']";
          local_278._16_8_ =
               (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_288;
          write.handler_ =
               (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                *)local_288;
          while (pcVar7 != "") {
            cVar1 = *pcVar7;
            pcVar10 = pcVar7;
            while (cVar1 != '{') {
              pcVar10 = pcVar10 + 1;
              if (pcVar10 == "") {
                ::fmt::v10::detail::
                parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ::writer::operator()((writer *)&write,pcVar7,"");
                goto LAB_001436c1;
              }
              cVar1 = *pcVar10;
            }
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::writer::operator()((writer *)&write,pcVar7,pcVar10);
            pcVar7 = ::fmt::v10::detail::
                     parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string,std::__cxx11::string>&>
                               (pcVar10,"",
                                (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                                 *)local_288);
          }
LAB_001436c1:
          utils::Hex<unsigned_long>((string *)&write,local_298);
          local_288 = (undefined1  [8])write.handler_;
          _Stack_280._M_p = pcStack_1f0;
          local_278._0_8_ = nwk.mName._M_dataplus._M_p;
          local_278._8_8_ = nwk.mName._M_string_length;
          fmt_06.size_ = 0xdd;
          fmt_06.data_ = (char *)0x2e;
          args_06.field_1.args_ = in_R9.args_;
          args_06.desc_ = (unsigned_long_long)local_288;
          ::fmt::v10::vformat_abi_cxx11_
                    (&local_250,(v10 *)"loading PSKc ignored for CCM network [{}:\'{}\']",fmt_06,
                     args_06);
          Log(kDebug,(string *)local_220,&local_250);
          std::__cxx11::string::~string((string *)&local_250);
          std::__cxx11::string::~string((string *)&write);
          this_00 = (string *)local_220;
          goto LAB_00143235;
        }
      }
      if (dtlsConfig.mCertificate.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          dtlsConfig.mCertificate.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  (&aConfig->mCertificate,&dtlsConfig.mCertificate);
      }
      if (dtlsConfig.mPrivateKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          dtlsConfig.mPrivateKey.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  (&aConfig->mPrivateKey,&dtlsConfig.mPrivateKey);
      }
      if (dtlsConfig.mTrustAnchor.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          dtlsConfig.mTrustAnchor.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  (&aConfig->mTrustAnchor,&dtlsConfig.mTrustAnchor);
      }
      if (dtlsConfig.mCommissionerToken.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          dtlsConfig.mCommissionerToken.
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  (&aConfig->mCommissionerToken,&dtlsConfig.mCommissionerToken);
      }
      if (dtlsConfig.mPSKc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
          .super__Vector_impl_data._M_finish !=
          dtlsConfig.mPSKc.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
          .super__Vector_impl_data._M_start) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  (&aConfig->mPSKc,&dtlsConfig.mPSKc);
      }
      bVar4 = security_material::SecurityMaterials::IsEmpty(&dtlsConfig,0 < local_22c);
      if (bVar4) {
        std::__cxx11::string::string
                  ((string *)&local_110,
                   "no updates to DTLS configuration, default configuration will be used",
                   (allocator *)local_288);
        InfoMsg(local_228,local_298,&local_110);
        std::__cxx11::string::~string((string *)&local_110);
      }
      if ((aConfig->mCertificate).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          (aConfig->mCertificate).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  (&dtlsConfig.mCertificate,&aConfig->mCertificate);
      }
      if ((aConfig->mPrivateKey).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          (aConfig->mPrivateKey).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  (&dtlsConfig.mPrivateKey,&aConfig->mPrivateKey);
      }
      if ((aConfig->mTrustAnchor).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_finish !=
          (aConfig->mTrustAnchor).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
          _M_impl.super__Vector_impl_data._M_start) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  (&dtlsConfig.mTrustAnchor,&aConfig->mTrustAnchor);
      }
      if ((aConfig->mCommissionerToken).
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_finish !=
          (aConfig->mCommissionerToken).
          super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl.
          super__Vector_impl_data._M_start) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  (&dtlsConfig.mCommissionerToken,&aConfig->mCommissionerToken);
      }
      if ((aConfig->mPSKc).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
          .super__Vector_impl_data._M_finish !=
          (aConfig->mPSKc).super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>._M_impl
          .super__Vector_impl_data._M_start) {
        std::vector<unsigned_char,_std::allocator<unsigned_char>_>::operator=
                  (&dtlsConfig.mPSKc,&aConfig->mPSKc);
      }
      bVar6 = security_material::SecurityMaterials::IsIncomplete
                        (&dtlsConfig,bVar6,(bool)((byte)local_28c & 1),0 < local_22c);
      if (!bVar6) goto LAB_0014359f;
      local_288._0_4_ = string_type;
      local_288._4_4_ = string_type;
      _Stack_280._M_p = "incomplete DTLS configuration for the network [{}:\'{}\']";
      local_278._0_8_ = 0x37;
      local_278._8_8_ = 0x200000000;
      local_260 = ::fmt::v10::detail::
                  parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
      ;
      local_258 = ::fmt::v10::detail::
                  parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
      ;
      pcVar7 = "incomplete DTLS configuration for the network [{}:\'{}\']";
      local_278._16_8_ =
           (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_288;
      write.handler_ =
           (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_288;
      while (pcVar7 != "") {
        cVar1 = *pcVar7;
        pcVar10 = pcVar7;
        while (cVar1 != '{') {
          pcVar10 = pcVar10 + 1;
          if (pcVar10 == "") {
            ::fmt::v10::detail::
            parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ::writer::operator()((writer *)&write,pcVar7,"");
            goto LAB_00143506;
          }
          cVar1 = *pcVar10;
        }
        ::fmt::v10::detail::
        parse_format_string<true,_char,_fmt::v10::detail::format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
        ::writer::operator()((writer *)&write,pcVar7,pcVar10);
        pcVar7 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string,std::__cxx11::string>&>
                           (pcVar10,"",
                            (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
                             *)local_288);
      }
LAB_00143506:
      utils::Hex<unsigned_long>((string *)&write,local_298);
      local_288 = (undefined1  [8])write.handler_;
      _Stack_280._M_p = pcStack_1f0;
      local_278._0_8_ = nwk.mName._M_dataplus._M_p;
      local_278._8_8_ = nwk.mName._M_string_length;
      fmt_05.size_ = 0xdd;
      fmt_05.data_ = (char *)0x37;
      args_05.field_1.args_ = in_R9.args_;
      args_05.desc_ = (unsigned_long_long)local_288;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_250,(v10 *)"incomplete DTLS configuration for the network [{}:\'{}\']",
                 fmt_05,args_05);
      local_220._0_4_ = kSecurity;
      std::__cxx11::string::string((string *)(local_220 + 8),(string *)&local_250);
      Error::operator=(__return_storage_ptr__,(Error *)local_220);
      std::__cxx11::string::~string((string *)(local_220 + 8));
      std::__cxx11::string::~string((string *)&local_250);
      psVar12 = (string *)&write;
    }
    else {
      local_288._0_4_ = string_type;
      _Stack_280._M_p = "network not found by XPAN \'{}\'";
      local_278._0_8_ = (pointer)0x1e;
      local_278._8_8_ = 0x100000000;
      local_260 = ::fmt::v10::detail::
                  parse_format_specs<std::__cxx11::string,fmt::v10::detail::compile_parse_context<char>>
      ;
      pcVar7 = "network not found by XPAN \'{}\'";
      local_278._16_8_ =
           (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_288;
      while (pcVar10 = pcVar7, pcVar10 != "") {
        pcVar7 = pcVar10 + 1;
        if (*pcVar10 == '}') {
          if ((pcVar7 == "") || (*pcVar7 != '}')) {
            ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
          }
          pcVar7 = pcVar10 + 2;
        }
        else if (*pcVar10 == '{') {
          pcVar7 = ::fmt::v10::detail::
                   parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,std::__cxx11::string>&>
                             (pcVar10,"",(format_string_checker<char> *)local_288);
        }
      }
      utils::Hex<unsigned_long>((string *)local_288,local_298);
      write.handler_ =
           (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
            *)local_288;
      fmt_00.size_ = 0xd;
      fmt_00.data_ = (char *)0x1e;
      args_00.field_1.args_ = in_R9.args_;
      args_00.desc_ = (unsigned_long_long)&write;
      ::fmt::v10::vformat_abi_cxx11_
                (&local_250,(v10 *)"network not found by XPAN \'{}\'",fmt_00,args_00);
      local_220._0_4_ = kNotFound;
      std::__cxx11::string::string((string *)(local_220 + 8),(string *)&local_250);
      Error::operator=(__return_storage_ptr__,(Error *)local_220);
      std::__cxx11::string::~string((string *)(local_220 + 8));
      std::__cxx11::string::~string((string *)&local_250);
      psVar12 = (string *)local_288;
    }
  }
  else {
    local_288._0_4_ = int_type;
    _Stack_280._M_p = "br lookup failed with status={}";
    local_278._0_8_ = (pointer)0x1f;
    local_278._8_8_ = 0x100000000;
    local_260 = ::fmt::v10::detail::
                parse_format_specs<int,fmt::v10::detail::compile_parse_context<char>>;
    pcVar7 = "br lookup failed with status={}";
    local_278._16_8_ =
         (format_string_checker<char,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
          *)local_288;
    while (pcVar10 = pcVar7, pcVar10 != "") {
      pcVar7 = pcVar10 + 1;
      if (*pcVar10 == '}') {
        if ((pcVar7 == "") || (*pcVar7 != '}')) {
          ::fmt::v10::detail::throw_format_error("unmatched \'}\' in format string");
        }
        pcVar7 = pcVar10 + 2;
      }
      else if (*pcVar10 == '{') {
        pcVar7 = ::fmt::v10::detail::
                 parse_replacement_field<char,fmt::v10::detail::format_string_checker<char,int>&>
                           (pcVar10,"",(format_string_checker<char> *)local_288);
      }
    }
    atVar8._1_7_ = 0;
    fmt.size_ = 1;
    fmt.data_ = (char *)0x1f;
    args.field_1.values_ = in_R9.values_;
    args.desc_ = (unsigned_long_long)local_288;
    local_288 = (undefined1  [8])atVar8;
    ::fmt::v10::vformat_abi_cxx11_(&local_250,(v10 *)"br lookup failed with status={}",fmt,args);
    local_220._0_4_ = kRegistryError;
    std::__cxx11::string::string((string *)(local_220 + 8),(string *)&local_250);
    Error::operator=(__return_storage_ptr__,(Error *)local_220);
    std::__cxx11::string::~string((string *)(local_220 + 8));
    psVar12 = &local_250;
  }
  std::__cxx11::string::~string((string *)psVar12);
LAB_0014359f:
  std::
  vector<ot::commissioner::persistent_storage::BorderRouter,_std::allocator<ot::commissioner::persistent_storage::BorderRouter>_>
  ::~vector(&brs);
  persistent_storage::Network::~Network(&nwk);
  security_material::SecurityMaterials::~SecurityMaterials(&dtlsConfig);
  std::__cxx11::string::~string((string *)&domainName);
  return __return_storage_ptr__;
}

Assistant:

Error JobManager::PrepareDtlsConfig(uint64_t aNid, Config &aConfig)
{
    Error             error;
    std::string       domainName;
    bool              isCCM = false;
    SecurityMaterials dtlsConfig;
    Network           nwk;
    BRArray           brs;
    bool              needCert = false;
    bool              needPSKc = false;
    RegistryStatus    status   = mInterpreter.mRegistry->GetBorderRoutersInNetwork(aNid, brs);

    VerifyOrExit(status == RegistryStatus::kSuccess,
                 error = ERROR_REGISTRY_ERROR("br lookup failed with status={}", static_cast<int>(status)));

    // review the network BRs connection modes that may require
    // certain supported type of credentials
    for (const auto &br : brs)
    {
        if (br.mAgent.mState.mConnectionMode == BorderAgent::State::ConnectionMode::kVendorSpecific ||
            br.mAgent.mState.mConnectionMode == BorderAgent::State::ConnectionMode::kX509Connection)
        {
            needCert = true;
        }
        if (br.mAgent.mState.mConnectionMode == BorderAgent::State::ConnectionMode::kVendorSpecific ||
            br.mAgent.mState.mConnectionMode == BorderAgent::State::ConnectionMode::kPSKcConnection)
        {
            needPSKc = true;
        }
    }

    /// @note: If vendor specific connection mode encountered, PSKc as
    ///        well as X.509 cert will be prepared to be available to
    ///        choose from; in case of another security material
    ///        type(s) required by BR vendor, please update
    ///        JobManager::PrepareDtlsConfig() method appropriately.

    status = mInterpreter.mRegistry->GetNetworkByXpan(aNid, nwk);
    VerifyOrExit(status == RegistryStatus::kSuccess,
                 error = ERROR_NOT_FOUND("network not found by XPAN '{}'", utils::Hex(aNid)));
    isCCM  = nwk.mCcm > 0;
    status = mInterpreter.mRegistry->GetDomainNameByXpan(aNid, domainName);
    if (status != RegistryStatus::kSuccess)
    {
        LOG_DEBUG(LOG_REGION_JOB_MANAGER, "{}: domain resolution failed with status={}", utils::Hex(aNid),
                  static_cast<int>(status));
    }

    aConfig.mEnableCcm = isCCM;
    if (!domainName.empty() && needCert)
    {
        aConfig.mDomainName = domainName;
        if (domainName != "DefaultDomain")
        {
            error = security_material::GetDomainSM(domainName, dtlsConfig);
            if (ERROR_NONE != error)
            {
                LOG_STR(DEBUG, LOG_REGION_JOB_MANAGER, error.GetMessage());
                if (ErrorCode::kNotFound != error.GetCode())
                {
                    WarningMsg(aNid, error.GetMessage());
                }
                error = ERROR_NONE;
            }
            if (!dtlsConfig.IsEmpty(isCCM))
            {
                if (needPSKc)
                {
                    /// @note: Please also note for CCM networks that only
                    ///        X.509 based credentials are valid for
                    ///        loading. Therefore, any other connection
                    ///        mode is considered a wrong configuration of
                    ///        border router, and respectively ignored.
                    LOG_DEBUG(LOG_REGION_JOB_MANAGER, "loading PSKc ignored for CCM network [{}:'{}']",
                              utils::Hex(aNid), nwk.mName);
                }
                goto update;
            }
        }
        else
        {
            // a network of DefaultDomain is a non-CCM one; we will
            // look up in a folder under nwk later
            error = ERROR_NONE;
        }
    }

    error = security_material::GetNetworkSM(utils::Hex(nwk.mXpan), needCert, needPSKc, dtlsConfig);
    if (ERROR_NONE != error)
    {
        LOG_STR(DEBUG, LOG_REGION_JOB_MANAGER, error.GetMessage());
        if (ErrorCode::kNotFound != error.GetCode())
        {
            WarningMsg(aNid, error.GetMessage());
        }
        // else we try a chance with nwk.mName later
        error = ERROR_NONE;
    }
    if (dtlsConfig.IsAnyFound(needCert, needPSKc))
    {
        goto update;
    }
    error = security_material::GetNetworkSM(nwk.mName, needCert, needPSKc, dtlsConfig);
    if (ERROR_NONE != error)
    {
        LOG_STR(DEBUG, LOG_REGION_JOB_MANAGER, error.GetMessage());
        if (ErrorCode::kNotFound != error.GetCode())
        {
            WarningMsg(aNid, error.GetMessage());
        }
        // nothing found, so continue with default values
        error = ERROR_NONE;
    }
update:

#define UPDATE_IF_SET(name)            \
    if (dtlsConfig.m##name.size() > 0) \
    aConfig.m##name = dtlsConfig.m##name

    UPDATE_IF_SET(Certificate);
    UPDATE_IF_SET(PrivateKey);
    UPDATE_IF_SET(TrustAnchor);
    UPDATE_IF_SET(CommissionerToken);
    UPDATE_IF_SET(PSKc);

#undef UPDATE_IF_SET

    if (dtlsConfig.IsEmpty(isCCM))
    {
        InfoMsg(aNid, "no updates to DTLS configuration, default configuration will be used");
    }

#define UPDATE_IF_SET(name)         \
    if (aConfig.m##name.size() > 0) \
    dtlsConfig.m##name = aConfig.m##name

    UPDATE_IF_SET(Certificate);
    UPDATE_IF_SET(PrivateKey);
    UPDATE_IF_SET(TrustAnchor);
    UPDATE_IF_SET(CommissionerToken);
    UPDATE_IF_SET(PSKc);

#undef UPDATE_IF_SET
    if (dtlsConfig.IsIncomplete(needCert, needPSKc, isCCM))
    {
        error = ERROR_SECURITY("incomplete DTLS configuration for the network [{}:'{}']", utils::Hex(aNid), nwk.mName);
    }
exit:
    return error;
}